

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O1

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  code *pcVar1;
  ulong uVar2;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 local_30;
  
  uVar2 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x30))
                    ((long *)CONCAT44(in_register_00000034,__fd));
  if ((uVar2 & 2) == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = (code *)0x0;
    local_30 = *(undefined8 *)(__addr[1].sa_data + 6);
    pcVar1 = *(code **)(__addr + 1);
    if (pcVar1 != (code *)0x0) {
      local_48._0_2_ = __addr->sa_family;
      local_48._2_1_ = __addr->sa_data[0];
      local_48._3_1_ = __addr->sa_data[1];
      local_48._4_1_ = __addr->sa_data[2];
      local_48._5_1_ = __addr->sa_data[3];
      local_48._6_1_ = __addr->sa_data[4];
      local_48._7_1_ = __addr->sa_data[5];
      uStack_40 = *(undefined8 *)(__addr->sa_data + 6);
      __addr[1].sa_family = 0;
      __addr[1].sa_data[0] = '\0';
      __addr[1].sa_data[1] = '\0';
      __addr[1].sa_data[2] = '\0';
      __addr[1].sa_data[3] = '\0';
      __addr[1].sa_data[4] = '\0';
      __addr[1].sa_data[5] = '\0';
      __addr[1].sa_data[6] = '\0';
      __addr[1].sa_data[7] = '\0';
      __addr[1].sa_data[8] = '\0';
      __addr[1].sa_data[9] = '\0';
      __addr[1].sa_data[10] = '\0';
      __addr[1].sa_data[0xb] = '\0';
      __addr[1].sa_data[0xc] = '\0';
      __addr[1].sa_data[0xd] = '\0';
      local_38 = pcVar1;
    }
    listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::ref_counter::single_threaded>
    ::create_node<std::function<void()>>
              ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::ref_counter::single_threaded>
                *)this,__fd + 8,(function<void_()> *)(ulong)__len);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,3);
    }
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"The signal restrains connecting synchronous handlers!")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_async_only))
                WIGWAG_THROW("The signal restrains connecting synchronous handlers!");

            return listenable_base::connect(std::move(handler), attributes);
        }